

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCreate::Deserialize(LogicalCreate *this,Deserializer *deserializer)

{
  LogicalOperatorType type;
  int iVar1;
  LogicalCreate *this_00;
  ClientContext *context;
  pointer *__ptr;
  CreateInfo *pCVar2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_38;
  CreateInfo *local_30;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"info");
  if ((char)iVar1 == '\0') {
    pCVar2 = (CreateInfo *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pCVar2 = (CreateInfo *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      CreateInfo::Deserialize((CreateInfo *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pCVar2 = local_30;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (LogicalCreate *)operator_new(0x78);
  type = Deserializer::Get<duckdb::LogicalOperatorType>(deserializer);
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  local_38._M_head_impl = pCVar2;
  LogicalCreate(this_00,type,context,
                (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                &local_38);
  if (local_38._M_head_impl != (CreateInfo *)0x0) {
    (*((local_38._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalCreate::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalCreate>(new LogicalCreate(deserializer.Get<LogicalOperatorType>(), deserializer.Get<ClientContext &>(), std::move(info)));
	return std::move(result);
}